

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-lexer.cpp
# Opt level: O1

void __thiscall LexerTest_LexBlockComment_Test::TestBody(LexerTest_LexBlockComment_Test *this)

{
  char *pcVar1;
  char *in_R9;
  undefined1 auVar2 [16];
  string_view buffer;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_e0;
  bool local_c0;
  undefined1 local_b8 [8];
  Lexer lexer;
  undefined1 local_58 [8];
  AssertionResult gtest_ar;
  TextPos local_38;
  undefined1 local_28 [8];
  AssertionResult gtest_ar_;
  
  local_c0 = false;
  buffer._M_str = "1(; whoo! 2\n (; \n3\n ;) 4 (;) 5 ;) \n;)6";
  buffer._M_len = 0x26;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_b8,buffer,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_e0);
  if (local_c0 == true) {
    local_c0 = false;
    if (local_e0._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_e0._M_value + 0x10)) {
      operator_delete((void *)local_e0._M_value._M_dataplus._M_p,local_e0._16_8_ + 1);
    }
  }
  local_28[0] = local_b8 !=
                (undefined1  [8])
                lexer.file.
                super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                ._M_payload.
                super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                .
                super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ._32_8_;
  gtest_ar_.success_ = false;
  gtest_ar_._1_7_ = 0;
  if (local_b8 ==
      (undefined1  [8])
      lexer.file.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._32_8_) {
    testing::Message::Message((Message *)&local_38);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_58,(internal *)local_28,(AssertionResult *)"lexer.empty()","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&lexer.buffer._M_str,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x44,(char *)CONCAT71(local_58._1_7_,local_58[0]));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&lexer.buffer._M_str,(Message *)&local_38);
  }
  else {
    auVar2 = ::wasm::WATParser::Lexer::position(local_b8);
    gtest_ar_._0_8_ = auVar2._8_8_;
    local_28 = auVar2._0_8_;
    local_38.line = 1;
    local_38.col = 0;
    testing::internal::CmpHelperEQ<wasm::WATParser::TextPos,wasm::WATParser::TextPos>
              ((internal *)local_58,"lexer.position()","(TextPos{1, 0})",(TextPos *)local_28,
               &local_38);
    if (local_58[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_28);
      if (gtest_ar._0_8_ == 0) {
        pcVar1 = "";
      }
      else {
        pcVar1 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_38,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                 ,0x45,pcVar1);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_38,(Message *)local_28);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_38);
      if (local_28 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_28 + 8))();
      }
    }
    if (gtest_ar._0_8_ != 0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&gtest_ar,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   gtest_ar._0_8_);
    }
    local_28 = (undefined1  [8])::wasm::WATParser::Lexer::takeI<unsigned_int>();
    local_38.line = CONCAT44(local_38.line._4_4_,1);
    testing::internal::CmpHelperEQ<std::optional<unsigned_int>,int>
              ((internal *)local_58,"lexer.takeI32()","1",(optional<unsigned_int> *)local_28,
               (int *)&local_38);
    if (local_58[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_28);
      if (gtest_ar._0_8_ == 0) {
        pcVar1 = "";
      }
      else {
        pcVar1 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_38,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                 ,0x46,pcVar1);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_38,(Message *)local_28);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_38);
      if (local_28 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_28 + 8))();
      }
    }
    if (gtest_ar._0_8_ != 0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&gtest_ar,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   gtest_ar._0_8_);
    }
    local_28[0] = local_b8 !=
                  (undefined1  [8])
                  lexer.file.
                  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                  ._M_payload.
                  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                  .
                  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ._32_8_;
    gtest_ar_.success_ = false;
    gtest_ar_._1_7_ = 0;
    if (local_b8 ==
        (undefined1  [8])
        lexer.file.
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._32_8_) {
      testing::Message::Message((Message *)&local_38);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_58,(internal *)local_28,(AssertionResult *)"lexer.empty()","true",
                 "false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&lexer.buffer._M_str,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                 ,0x48,(char *)CONCAT71(local_58._1_7_,local_58[0]));
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&lexer.buffer._M_str,(Message *)&local_38);
    }
    else {
      auVar2 = ::wasm::WATParser::Lexer::position(local_b8);
      gtest_ar_._0_8_ = auVar2._8_8_;
      local_28 = auVar2._0_8_;
      local_38.line = 5;
      local_38.col = 2;
      testing::internal::CmpHelperEQ<wasm::WATParser::TextPos,wasm::WATParser::TextPos>
                ((internal *)local_58,"lexer.position()","(TextPos{5, 2})",(TextPos *)local_28,
                 &local_38);
      if (local_58[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_28);
        if (gtest_ar._0_8_ == 0) {
          pcVar1 = "";
        }
        else {
          pcVar1 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_38,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                   ,0x49,pcVar1);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_38,(Message *)local_28);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_38);
        if (local_28 != (undefined1  [8])0x0) {
          (**(code **)(*(long *)local_28 + 8))();
        }
      }
      if (gtest_ar._0_8_ != 0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&gtest_ar,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     gtest_ar._0_8_);
      }
      local_28 = (undefined1  [8])::wasm::WATParser::Lexer::takeI<unsigned_int>();
      local_38.line = CONCAT44(local_38.line._4_4_,6);
      testing::internal::CmpHelperEQ<std::optional<unsigned_int>,int>
                ((internal *)local_58,"lexer.takeI32()","6",(optional<unsigned_int> *)local_28,
                 (int *)&local_38);
      if (local_58[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_28);
        if (gtest_ar._0_8_ == 0) {
          pcVar1 = "";
        }
        else {
          pcVar1 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_38,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                   ,0x4a,pcVar1);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_38,(Message *)local_28);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_38);
        if (local_28 != (undefined1  [8])0x0) {
          (**(code **)(*(long *)local_28 + 8))();
        }
      }
      if (gtest_ar._0_8_ != 0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&gtest_ar,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     gtest_ar._0_8_);
      }
      local_28[0] = local_b8 ==
                    (undefined1  [8])
                    lexer.file.
                    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                    ._M_payload.
                    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                    .
                    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ._32_8_;
      gtest_ar_.success_ = false;
      gtest_ar_._1_7_ = 0;
      if (local_b8 ==
          (undefined1  [8])
          lexer.file.
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._32_8_) goto LAB_001fbeb7;
      testing::Message::Message((Message *)&local_38);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_58,(internal *)local_28,(AssertionResult *)"lexer.empty()","false",
                 "true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&lexer.buffer._M_str,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                 ,0x4c,(char *)CONCAT71(local_58._1_7_,local_58[0]));
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&lexer.buffer._M_str,(Message *)&local_38);
    }
  }
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&lexer.buffer._M_str);
  if ((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)CONCAT71(local_58._1_7_,local_58[0]) != &gtest_ar.message_) {
    operator_delete((undefined1 *)CONCAT71(local_58._1_7_,local_58[0]),
                    (long)gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl + 1);
  }
  if ((long *)local_38.line != (long *)0x0) {
    (**(code **)(*(long *)local_38.line + 8))();
  }
LAB_001fbeb7:
  if (gtest_ar_._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 gtest_ar_._0_8_);
  }
  if (lexer.file.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_payload._24_1_ == '\x01') {
    lexer.file.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_payload._24_1_ = 0;
    if (lexer.annotations.
        super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage !=
        (pointer)((long)&lexer.file.
                         super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                         ._M_payload.
                         super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                         .
                         super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         ._M_payload + 8U)) {
      operator_delete(lexer.annotations.
                      super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                      lexer.file.
                      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                      ._M_payload.
                      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                      .
                      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ._M_payload._M_value._M_string_length + 1);
    }
  }
  if (lexer.pos != 0) {
    operator_delete((void *)lexer.pos,
                    (long)lexer.annotations.
                          super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
                          ._M_impl.super__Vector_impl_data._M_finish - lexer.pos);
  }
  return;
}

Assistant:

TEST(LexerTest, LexBlockComment) {
  Lexer lexer("1(; whoo! 2\n (; \n3\n ;) 4 (;) 5 ;) \n;)6"sv);

  ASSERT_FALSE(lexer.empty());
  EXPECT_EQ(lexer.position(), (TextPos{1, 0}));
  EXPECT_EQ(lexer.takeI32(), 1);

  ASSERT_FALSE(lexer.empty());
  EXPECT_EQ(lexer.position(), (TextPos{5, 2}));
  EXPECT_EQ(lexer.takeI32(), 6);

  EXPECT_TRUE(lexer.empty());
}